

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O2

wchar_t is_dh_tile(wchar_t a,wchar_t c)

{
  wchar_t wVar1;
  
  wVar1 = L'\0';
  if (((current_graphics_mode != (graphics_mode *)0x0 && (char)a < '\0') &&
      (current_graphics_mode->overdrawRow != 0)) &&
     ((uint)current_graphics_mode->overdrawRow <= (uint)(a & 0x7fU))) {
    wVar1 = (wchar_t)((uint)(a & 0x7fU) <= (uint)current_graphics_mode->overdrawMax);
  }
  return wVar1;
}

Assistant:

int is_dh_tile(int a, wchar_t c)
{
	int tileset_row;

	/*
	 * If it's not a tile (assumes tiles have high-bit set on the
	 * attribute), graphics aren't enabled, or the graphics mode doesn't
	 * use double-height tiles, it can't be double-height.
	 */
	if (!(a & 0x80) || !current_graphics_mode ||
			!current_graphics_mode->overdrawRow) {
		return 0;
	}
	/* Test the row for the tile. */
	tileset_row = a & 0x7f;
	return tileset_row >= current_graphics_mode->overdrawRow &&
		tileset_row <= current_graphics_mode->overdrawMax;
}